

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  bool bVar1;
  CURLUPart CVar2;
  uchar in;
  _Bool _Var3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  CURLcode CVar7;
  uint uVar8;
  CURLUcode CVar9;
  size_t sVar10;
  Curl_handler *pCVar11;
  size_t sVar12;
  char *pcVar13;
  long lVar14;
  size_t sVar15;
  char *pcVar16;
  CURLUPart CVar17;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  CURLU *pCVar21;
  bool bVar22;
  bool bVar23;
  char *oldurl;
  CURLU *local_90;
  long local_70;
  dynbuf local_60;
  char *local_40;
  CURLU *local_38;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      pCVar21 = (CURLU *)0x0;
      break;
    case CURLUPART_SCHEME:
      pCVar21 = u;
      break;
    case CURLUPART_USER:
      pCVar21 = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      pCVar21 = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      pCVar21 = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      pCVar21 = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      pCVar21 = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      pCVar21 = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      pCVar21 = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      pCVar21 = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      pCVar21 = (CURLU *)&u->zoneid;
      break;
    default:
      goto LAB_005fa8a3;
    }
    if (pCVar21 == (CURLU *)0x0) {
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      u->portnum = 0;
      return CURLUE_OK;
    }
    if (pCVar21->scheme == (char *)0x0) {
      return CURLUE_OK;
    }
    (*Curl_cfree)(pCVar21->scheme);
    pCVar21->scheme = (char *)0x0;
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
LAB_005fa8a3:
    return CURLUE_UNKNOWN_PART;
  }
  bVar20 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    sVar10 = Curl_is_absolute_url(part,(char *)0x0,(size_t)part,(flags & 0x204) != 0);
    if ((sVar10 == 0) &&
       (CVar9 = curl_url_get(u,CURLUPART_URL,&local_60.bufr,flags), CVar9 == CURLUE_OK)) {
      pcVar13 = concat_url(local_60.bufr,part);
      (*Curl_cfree)(local_60.bufr);
      if (pcVar13 != (char *)0x0) {
        CVar9 = parseurl_and_replace(pcVar13,u,flags);
        (*Curl_cfree)(pcVar13);
        return CVar9;
      }
      return CURLUE_OUT_OF_MEMORY;
    }
    CVar9 = parseurl_and_replace(part,u,flags);
    return CVar9;
  case CURLUPART_SCHEME:
    sVar15 = strlen(part);
    CVar17 = 0x1b;
    if (0x28 < sVar15) {
      return CURLUE_BAD_SCHEME;
    }
    bVar5 = 1;
    if (((flags & 8) == 0) &&
       (pCVar11 = Curl_builtin_scheme(part,0xffffffffffffffff), pCVar11 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    uVar8 = 0;
    bVar23 = true;
    bVar20 = 0;
    local_70 = 0;
    local_90 = u;
    goto LAB_005fa565;
  case CURLUPART_USER:
    local_90 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_90 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_90 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    sVar15 = strcspn(part," \r\n");
    sVar12 = strlen(part);
    if (sVar12 == sVar15) {
      local_90 = (CURLU *)&u->host;
      (*Curl_cfree)(u->zoneid);
      u->zoneid = (char *)0x0;
    }
    else {
      local_90 = (CURLU *)0x0;
    }
    CVar17 = 0x15;
    if (sVar12 != sVar15) {
      return CURLUE_BAD_HOSTNAME;
    }
    bVar5 = 1;
    uVar8 = 0;
    bVar23 = true;
    local_70 = 0;
    goto LAB_005fa565;
  case CURLUPART_PORT:
    local_70 = strtol(part,&local_60.bufr,10);
    if (local_70 - 0x10000U < 0xffffffffffff0001) {
      bVar23 = false;
      local_90 = (CURLU *)0x0;
    }
    else {
      bVar23 = *local_60.bufr == '\0';
      local_90 = (CURLU *)0x0;
      if (bVar23) {
        local_90 = (CURLU *)&u->port;
      }
    }
    CVar17 = CURLUPART_OPTIONS;
    if (!bVar23) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    bVar5 = 1;
    uVar8 = 0;
    bVar23 = true;
    bVar20 = 0;
    goto LAB_005fa565;
  case CURLUPART_PATH:
    local_90 = (CURLU *)&u->path;
    bVar23 = true;
    uVar8 = 0;
    bVar5 = 0;
    goto LAB_005fa55c;
  case CURLUPART_QUERY:
    bVar23 = -1 < (char)(byte)flags;
    uVar8 = flags >> 8;
    local_90 = (CURLU *)&u->query;
    bVar5 = 1;
    goto LAB_005fa55c;
  case CURLUPART_FRAGMENT:
    local_90 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_90 = (CURLU *)&u->zoneid;
  }
  bVar5 = 1;
  uVar8 = 0;
  bVar23 = true;
LAB_005fa55c:
  local_70 = 0;
  CVar17 = what;
LAB_005fa565:
  pcVar13 = (char *)strlen(part);
  if (pcVar13 < " cmStateSnapshot &)") {
    if (bVar20 == 0) {
      pcVar13 = (*Curl_cstrdup)(part);
      pcVar16 = pcVar13;
      if (pcVar13 != (char *)0x0) {
        do {
          lVar14 = 1;
          if (*pcVar16 == '%') {
            bVar20 = pcVar16[1];
            if (((((byte)(bVar20 - 0x30) < 10) ||
                 ((bVar20 - 0x41 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)(bVar20 - 0x41) & 0x3f) & 1) != 0)))) &&
                ((bVar5 = pcVar16[2], (byte)(bVar5 - 0x30) < 10 ||
                 ((bVar5 - 0x41 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)(bVar5 - 0x41) & 0x3f) & 1) != 0)))))) &&
               ((byte)(bVar20 + 0xbf) < 0x1a || (byte)(bVar5 + 0xbf) < 0x1a)) {
              cVar4 = Curl_raw_tolower(bVar20);
              pcVar16[1] = cVar4;
              cVar4 = Curl_raw_tolower(pcVar16[2]);
              pcVar16[2] = cVar4;
              lVar14 = 3;
            }
          }
          else if (*pcVar16 == '\0') goto LAB_005fa7c0;
          pcVar16 = pcVar16 + lVar14;
        } while( true );
      }
      CVar17 = CURLUPART_PATH;
LAB_005fa7c0:
      if (pcVar13 != (char *)0x0) goto LAB_005fa7e6;
    }
    else {
      Curl_dyn_init(&local_60,(long)pcVar13 * 3 + 1);
      in = *part;
      bVar22 = in == '\0';
      local_38 = u;
      if (!bVar22) {
        local_40 = part;
        uVar18 = uVar8;
        do {
          if (in == ' ' && !bVar23) {
            CVar7 = Curl_dyn_addn(&local_60,"+",1);
            if (CVar7 == CURLE_OK) goto LAB_005fa698;
            bVar1 = false;
            CVar2 = CURLUPART_PATH;
          }
          else {
            _Var3 = Curl_isunreserved(in);
            if (((_Var3) || ((bool)(~bVar5 & *part == '/'))) ||
               ((*part == '=' && ((uVar18 & 1) != 0)))) {
              uVar6 = uVar18 & 0xff;
              bVar1 = false;
              uVar19 = uVar6;
              if ((uVar18 & 1) != 0) {
                uVar19 = 0;
              }
              uVar18 = uVar19;
              if (*part != '=') {
                uVar18 = uVar6;
              }
              CVar7 = Curl_dyn_addn(&local_60,part,1);
              if (CVar7 == CURLE_OK) goto LAB_005fa698;
              CVar2 = CURLUPART_PATH;
            }
            else {
              bVar1 = false;
              CVar7 = Curl_dyn_addf(&local_60,"%%%02x");
              CVar2 = CURLUPART_PATH;
              if (CVar7 == CURLE_OK) {
LAB_005fa698:
                bVar1 = true;
                CVar2 = CVar17;
              }
            }
          }
          CVar17 = CVar2;
          pcVar13 = local_40;
          if (!bVar1) goto LAB_005fa7d2;
          in = part[1];
          part = part + 1;
          bVar22 = in == '\0';
        } while (!bVar22);
      }
      pcVar13 = Curl_dyn_ptr(&local_60);
LAB_005fa7d2:
      u = local_38;
      if (bVar22) {
LAB_005fa7e6:
        if ((uVar8 & 1) != 0) {
          pcVar16 = u->query;
          if (pcVar16 == (char *)0x0) {
            sVar15 = 0;
          }
          else {
            sVar15 = strlen(pcVar16);
          }
          if (sVar15 != 0) {
            cVar4 = pcVar16[sVar15 - 1];
            Curl_dyn_init(&local_60,8000000);
            CVar7 = Curl_dyn_addn(&local_60,u->query,sVar15);
            if ((CVar7 == CURLE_OK) &&
               (((cVar4 == '&' || (CVar7 = Curl_dyn_addn(&local_60,"&",1), CVar7 == CURLE_OK)) &&
                (CVar7 = Curl_dyn_add(&local_60,pcVar13), CVar7 == CURLE_OK)))) {
              (*Curl_cfree)(pcVar13);
              (*Curl_cfree)(local_90->scheme);
              pcVar16 = Curl_dyn_ptr(&local_60);
              local_90->scheme = pcVar16;
              CVar17 = CURLUPART_URL;
            }
            else {
              (*Curl_cfree)(pcVar13);
              CVar17 = CURLUPART_PATH;
            }
          }
          if (sVar15 != 0) goto LAB_005fa57a;
        }
        if (what == CURLUPART_HOST) {
          sVar15 = strlen(pcVar13);
          bVar23 = true;
          if ((((flags >> 10 & 1) == 0) || (sVar15 != 0)) &&
             (CVar9 = hostname_check(u,pcVar13,sVar15), CVar9 != CURLUE_OK)) {
            (*Curl_cfree)(pcVar13);
            CVar17 = 0x15;
            bVar23 = false;
          }
          if (!bVar23) goto LAB_005fa57a;
        }
        (*Curl_cfree)(local_90->scheme);
        local_90->scheme = pcVar13;
        bVar23 = true;
        goto LAB_005fa57c;
      }
    }
  }
  else {
    CVar17 = CURLUPART_PASSWORD;
  }
LAB_005fa57a:
  bVar23 = false;
LAB_005fa57c:
  if ((bVar23) && (CVar17 = CURLUPART_URL, local_70 != 0)) {
    u->portnum = local_70;
  }
  return CVar17;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_BAD_SCHEME;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part, CURL_ZERO_TERMINATED))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST: {
    size_t len = strcspn(part, " \r\n");
    if(strlen(part) != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  }
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute url in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    result = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      struct dynbuf enc;

      Curl_dyn_init(&enc, nalloc * 3 + 1);

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(Curl_isunreserved(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else {
          result = Curl_dyn_addf(&enc, "%%%02x", *i);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
      }
      newp = Curl_dyn_ptr(&enc);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf enc;
        Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&enc, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&enc, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&enc, newp))
          goto nomem;
        free((char *)newp);
        free(*storep);
        *storep = Curl_dyn_ptr(&enc);
        return CURLUE_OK;
        nomem:
        free((char *)newp);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    if(what == CURLUPART_HOST) {
      size_t n = strlen(newp);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it's allowed to be empty. */
      }
      else {
        if(hostname_check(u, (char *)newp, n)) {
          free((char *)newp);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}